

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# silent_printf.cpp
# Opt level: O1

int Silent_WideCharToMultiByte
              (LPCWSTR lpWideCharStr,int cchWideChar,LPSTR lpMultiByteStr,int cbMultiByte)

{
  LPCWSTR pWVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  WCHAR WVar7;
  
  uVar6 = (ulong)(uint)cchWideChar;
  iVar3 = 0;
  if (lpWideCharStr != (LPCWSTR)lpMultiByteStr && lpWideCharStr != (LPCWSTR)0x0) {
    if (cchWideChar == -1) {
      if (*lpWideCharStr == L'\0') {
        uVar6 = 1;
      }
      else {
        uVar6 = 1;
        do {
          pWVar1 = lpWideCharStr + uVar6;
          uVar6 = uVar6 + 1;
        } while (*pWVar1 != L'\0');
      }
    }
    iVar5 = (int)uVar6;
    iVar3 = iVar5;
    if (((cbMultiByte != 0) && (iVar3 = 0, iVar5 <= cbMultiByte)) && (iVar3 = iVar5, 0 < iVar5)) {
      iVar2 = iVar5 + 1;
      lVar4 = 0;
      do {
        WVar7 = lpWideCharStr[lVar4];
        if (0xff < (ushort)WVar7) {
          WVar7 = L'?';
        }
        lpMultiByteStr[lVar4] = (CHAR)WVar7;
        lVar4 = lVar4 + 1;
        iVar2 = iVar2 + -1;
      } while (1 < iVar2);
    }
  }
  return iVar3;
}

Assistant:

int Silent_WideCharToMultiByte(LPCWSTR lpWideCharStr, int cchWideChar,
                               LPSTR lpMultiByteStr, int cbMultiByte)
{
    INT retval =0;

    if ((lpWideCharStr == NULL)||
        (lpWideCharStr == (LPCWSTR) lpMultiByteStr))
    {
        goto EXIT;
    }

    if (cchWideChar == -1)
    {
        cchWideChar = Silent_PAL_wcslen(lpWideCharStr) + 1;
    }

    if (cbMultiByte == 0)
    {
        retval = cchWideChar;
        goto EXIT;
    }
    else if(cbMultiByte < cchWideChar)
    {
        retval = 0;
        goto EXIT;
    }
    
    retval = cchWideChar;
    while(cchWideChar > 0)
    {
        if(*lpWideCharStr > 255)
        {
            *lpMultiByteStr = '?';
        }
        else
        {
            *lpMultiByteStr = (unsigned char)*lpWideCharStr;
        }
        lpMultiByteStr++;
        lpWideCharStr++;
        cchWideChar--;
    }

EXIT:
    return retval;
}